

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.cpp
# Opt level: O0

MessageBuilder * __thiscall
tcu::MessageBuilder::operator=(MessageBuilder *this,MessageBuilder *other)

{
  string local_38 [32];
  MessageBuilder *local_18;
  MessageBuilder *other_local;
  MessageBuilder *this_local;
  
  this->m_log = other->m_log;
  local_18 = other;
  other_local = this;
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::str((string *)&this->m_str);
  std::__cxx11::string::~string(local_38);
  return this;
}

Assistant:

MessageBuilder& MessageBuilder::operator= (const MessageBuilder& other)
{
	m_log = other.m_log;
	m_str.str(other.m_str.str());
	return *this;
}